

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DoubleField.cpp
# Opt level: O2

void __thiscall DoubleField::DoubleField(DoubleField *this,string *name,int size)

{
  DoubleElement *pDVar1;
  int iVar2;
  string sStack_48;
  
  std::__cxx11::string::string((string *)&sStack_48,(string *)name);
  Tag::Tag(&this->super_Tag,&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  (this->super_Tag).super_StreamObject._vptr_StreamObject = (_func_int **)&PTR_write_0010ad50;
  if (size == 0) {
    pDVar1 = (DoubleElement *)operator_new(0x48);
    DoubleElement::DoubleElement(pDVar1);
    Tag::addElement(&this->super_Tag,(StreamObject *)pDVar1);
  }
  else {
    iVar2 = 0;
    if (0 < size) {
      iVar2 = size;
    }
    while (iVar2 != 0) {
      pDVar1 = (DoubleElement *)operator_new(0x48);
      DoubleElement::DoubleElement(pDVar1);
      Tag::addElement(&this->super_Tag,(StreamObject *)pDVar1);
      iVar2 = iVar2 + -1;
    }
  }
  (this->super_Tag)._lineSize = 1;
  (this->super_Tag)._numberOfLines = size;
  return;
}

Assistant:

DoubleField::DoubleField( std::string name, int size ) : Tag( name )
{
	// we have to add at least one element
	if ( size == 0 )
	{
		addElement( new DoubleElement() );
	}
	else
	{
		for ( int i = 0; i < size; i++ )
		{
			addElement( new DoubleElement() );
		}
	}
	// We want to treat each element
	// as seperate line
	_lineSize = 1;
	_numberOfLines = size;
}